

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  __m128i *input_00;
  int8_t *piVar1;
  undefined8 uVar2;
  int in_R9D;
  long lVar3;
  __m128i in [512];
  
  piVar1 = av1_fwd_txfm_shift_ls[0xb];
  uVar2 = 0x40;
  load_buffer_32x8n(input,in,stride,(int)*av1_fwd_txfm_shift_ls[0xb],0x40,in_R9D,(int)in[0][0]);
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x10) {
    input_00 = (__m128i *)((long)in[0] + lVar3);
    uVar2 = 8;
    av1_fdct64_sse4_1(input_00,input_00,'\r',8,8);
  }
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 0x400) {
    col_txfm_16x16_rounding((__m128i *)((long)in[0] + lVar3),-(int)piVar1[1]);
  }
  transpose_8nx8n(in,(__m128i *)coeff,0x20,0x40);
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x10) {
    av1_fdct32_sse4_1((__m128i *)((long)coeff + lVar3),(__m128i *)((long)in[0] + lVar3),0xb,0x10);
  }
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 0x100) {
    av1_round_shift_rect_array_32_sse4_1
              ((__m128i *)((long)in[0] + lVar3),(__m128i *)coeff,8,-(int)piVar1[2],(int)uVar2);
    coeff = (int32_t *)((long)coeff + 0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X64];
  const int txw_idx = get_txw_idx(TX_32X64);
  const int txh_idx = get_txh_idx(TX_32X64);
  const int txfm_size_col = tx_size_wide[TX_32X64];
  const int txfm_size_row = tx_size_high[TX_32X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], txfm_size_row);
  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1((in + i), (in + i), bitcol, num_col, num_col);
  }
  for (int i = 0; i < num_col; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_row), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct32_sse4_1((outcoef128 + i), (in + i), bitrow, num_row);
  }
  for (int i = 0; i < txfm_size_col; i++) {
    av1_round_shift_rect_array_32_sse4_1(in + i * 16, outcoef128 + i * 8, 8,
                                         -shift[2], NewSqrt2);
  }
  (void)bd;
}